

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int ffcalchist(long totalrows,long offset,long firstrow,long nrows,int ncols,iteratorCol *colpars,
              void *userPointer)

{
  int *piVar1;
  short *psVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  iteratorCol *piVar9;
  long lVar10;
  char cVar11;
  short sVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  float fVar16;
  double dVar17;
  char *local_60;
  double *colptr [5];
  
  colptr[2] = (double *)0x0;
  colptr[3] = (double *)0x0;
  colptr[0] = (double *)0x0;
  colptr[1] = (double *)0x0;
  colptr[4] = (double *)0x0;
  if (firstrow == 1) {
    local_60 = *(char **)((long)userPointer + 0xe8);
    *(char **)((long)userPointer + 0xf0) = local_60;
  }
  else {
    local_60 = *(char **)((long)userPointer + 0xf0);
  }
  lVar15 = 0xc;
  lVar10 = 0;
  for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
    uVar3 = *(uint *)((long)userPointer + lVar8 * 4 + 0x100);
    colptr[lVar8] = (double *)0x0;
    if (-1 < (int)uVar3 && (lVar8 == 4 || lVar8 < *(int *)((long)userPointer + 0x10))) {
      iVar4 = *(int *)(*(long *)((long)userPointer + 0x120) + lVar15 * 8);
      if ((long)iVar4 < 1) {
        piVar9 = (iteratorCol *)((ulong)uVar3 * 0x110 + *(long *)((long)userPointer + 0x118));
      }
      else {
        piVar9 = (iteratorCol *)((ulong)uVar3 * 0x110 + *(long *)((long)userPointer + 0x118));
        iVar5 = fits_parser_workfn(totalrows,offset,firstrow,nrows,iVar4,piVar9,
                                   (void *)(*(long *)((long)userPointer + 0x128) + lVar10));
        if (iVar5 != 0) {
          return iVar5;
        }
        piVar9 = piVar9 + (long)iVar4 + -1;
      }
      if (piVar9 != (iteratorCol *)0x0) {
        pdVar6 = (double *)fits_iter_get_array(piVar9);
        colptr[lVar8] = pdVar6;
      }
    }
    lVar15 = lVar15 + 0x1d;
    lVar10 = lVar10 + 0x90;
  }
  if (nrows < 1) {
    nrows = 0;
  }
  lVar15 = 1;
  lVar8 = lVar15;
  do {
    if (lVar15 == nrows + 1) {
      *(char **)((long)userPointer + 0xf0) = local_60;
      return 0;
    }
    if (local_60 == (char *)0x0) {
      pcVar14 = (char *)0x0;
LAB_001ba222:
      for (lVar10 = 1; lVar10 <= *(long *)((long)userPointer + 0xf8); lVar10 = lVar10 + 1) {
        dVar17 = colptr[0][lVar8 + lVar10 + -1];
        if (((dVar17 != -9.1191291391491e-36) || (NAN(dVar17))) &&
           ((colptr[4] == (double *)0x0 ||
            ((colptr[4][lVar8 + lVar10 + -1] != -9.1191291391491e-36 ||
             (NAN(colptr[4][lVar8 + lVar10 + -1]))))))) {
          dVar17 = (dVar17 - *(double *)((long)userPointer + 0x48)) /
                   *(double *)((long)userPointer + 0x88);
          lVar7 = (long)(dVar17 + 1.0);
          if ((0 < lVar7) &&
             ((lVar7 <= *(long *)((long)userPointer + 0x28) &&
              (dVar17 < *(double *)((long)userPointer + 0x68) ||
               dVar17 == *(double *)((long)userPointer + 0x68))))) {
            uVar3 = *(uint *)((long)userPointer + 0x10);
            if (1 < (int)uVar3) {
              dVar17 = colptr[1][lVar8 + lVar10 + -1];
              if ((((dVar17 == -9.1191291391491e-36) && (!NAN(dVar17))) ||
                  (dVar17 = (dVar17 - *(double *)((long)userPointer + 0x50)) /
                            *(double *)((long)userPointer + 0x90), dVar17 < 0.0)) ||
                 ((*(long *)((long)userPointer + 0x30) <= (long)dVar17 ||
                  (*(double *)((long)userPointer + 0x70) <= dVar17 &&
                   dVar17 != *(double *)((long)userPointer + 0x70))))) goto LAB_001ba26a;
              lVar7 = lVar7 + (long)dVar17 * *(long *)((long)userPointer + 0xb0);
              if (uVar3 != 2) {
                dVar17 = colptr[2][lVar8 + lVar10 + -1];
                if (((dVar17 == -9.1191291391491e-36) && (!NAN(dVar17))) ||
                   ((dVar17 = (dVar17 - *(double *)((long)userPointer + 0x58)) /
                              *(double *)((long)userPointer + 0x98), dVar17 < 0.0 ||
                    ((*(long *)((long)userPointer + 0x38) <= (long)dVar17 ||
                     (*(double *)((long)userPointer + 0x78) <= dVar17 &&
                      dVar17 != *(double *)((long)userPointer + 0x78))))))) goto LAB_001ba26a;
                lVar7 = lVar7 + (long)dVar17 * *(long *)((long)userPointer + 0xb8);
                if (3 < uVar3) {
                  dVar17 = colptr[3][lVar8 + lVar10 + -1];
                  if ((((dVar17 == -9.1191291391491e-36) && (!NAN(dVar17))) ||
                      (dVar17 = (dVar17 - *(double *)((long)userPointer + 0x60)) /
                                *(double *)((long)userPointer + 0xa0), dVar17 < 0.0)) ||
                     ((*(long *)((long)userPointer + 0x40) <= (long)dVar17 ||
                      (*(double *)((long)userPointer + 0x80) <= dVar17 &&
                       dVar17 != *(double *)((long)userPointer + 0x80))))) goto LAB_001ba26a;
                  lVar7 = lVar7 + (long)dVar17 * *(long *)((long)userPointer + 0xc0);
                }
              }
            }
            dVar17 = *(double *)((long)userPointer + 0xe0);
            if ((dVar17 != -9.1191291391491e-36) || (NAN(dVar17))) {
              iVar4 = *(int *)((long)userPointer + 0x24);
              iVar5 = (int)dVar17;
              if (iVar4 == 0xb) {
                *(char *)(*userPointer + lVar7) = *(char *)(*userPointer + lVar7) + (char)iVar5;
              }
              else if (iVar4 == 0x15) {
                psVar2 = (short *)(*userPointer + lVar7 * 2);
                *psVar2 = *psVar2 + (short)iVar5;
              }
              else {
                if (iVar4 == 0x52) goto LAB_001ba48d;
                if (iVar4 == 0x2a) {
                  lVar13 = *userPointer;
                  dVar17 = dVar17 + (double)*(float *)(lVar13 + lVar7 * 4);
LAB_001ba3fe:
                  fVar16 = (float)dVar17;
LAB_001ba437:
                  *(float *)(lVar13 + lVar7 * 4) = fVar16;
                }
                else if (iVar4 == 0x1f) {
                  piVar1 = (int *)(*userPointer + lVar7 * 4);
                  *piVar1 = *piVar1 + iVar5;
                }
              }
            }
            else {
              iVar4 = *(int *)((long)userPointer + 0x24);
              if (*(int *)((long)userPointer + 0xd0) == 0) {
                if (iVar4 == 0xb) {
                  cVar11 = (char)(int)colptr[4][lVar8 + lVar10 + -1];
                  goto LAB_001ba4a6;
                }
                if (iVar4 == 0x15) {
                  sVar12 = (short)(int)colptr[4][lVar8 + lVar10 + -1];
                  goto LAB_001ba466;
                }
                if (iVar4 == 0x52) {
                  dVar17 = colptr[4][lVar8 + lVar10 + -1];
                  goto LAB_001ba48d;
                }
                if (iVar4 == 0x2a) {
                  lVar13 = *userPointer;
                  dVar17 = (double)*(float *)(lVar13 + lVar7 * 4) + colptr[4][lVar8 + lVar10 + -1];
                  goto LAB_001ba3fe;
                }
                if (iVar4 == 0x1f) {
                  dVar17 = colptr[4][lVar8 + lVar10 + -1];
                  goto LAB_001ba3db;
                }
              }
              else if (iVar4 == 0xb) {
                cVar11 = (char)(int)(1.0 / colptr[4][lVar8 + lVar10 + -1]);
LAB_001ba4a6:
                *(char *)(*userPointer + lVar7) = *(char *)(*userPointer + lVar7) + cVar11;
              }
              else if (iVar4 == 0x15) {
                sVar12 = (short)(int)(1.0 / colptr[4][lVar8 + lVar10 + -1]);
LAB_001ba466:
                psVar2 = (short *)(*userPointer + lVar7 * 2);
                *psVar2 = *psVar2 + sVar12;
              }
              else if (iVar4 == 0x52) {
                dVar17 = 1.0 / colptr[4][lVar8 + lVar10 + -1];
LAB_001ba48d:
                *(double *)(*userPointer + lVar7 * 8) =
                     dVar17 + *(double *)(*userPointer + lVar7 * 8);
              }
              else {
                if (iVar4 == 0x2a) {
                  lVar13 = *userPointer;
                  fVar16 = (float)(1.0 / colptr[4][lVar8 + lVar10 + -1]) +
                           *(float *)(lVar13 + lVar7 * 4);
                  goto LAB_001ba437;
                }
                if (iVar4 == 0x1f) {
                  dVar17 = 1.0 / colptr[4][lVar8 + lVar10 + -1];
LAB_001ba3db:
                  piVar1 = (int *)(*userPointer + lVar7 * 4);
                  *piVar1 = *piVar1 + (int)dVar17;
                }
              }
            }
          }
        }
LAB_001ba26a:
      }
      lVar8 = lVar8 + lVar10 + -1;
      local_60 = pcVar14;
    }
    else {
      pcVar14 = local_60 + 1;
      if (*local_60 != '\0') goto LAB_001ba222;
      lVar8 = lVar8 + *(long *)((long)userPointer + 0xf8);
      local_60 = pcVar14;
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

int ffcalchist(long totalrows, long offset, long firstrow, long nrows,
             int ncols, iteratorCol *colpars, void *userPointer)
/*
   Interator work function that calculates values for the 2D histogram.
*/
{
    long ii, ipix, iaxisbin;
    double pix, axisbin;
    char *rowselect;
    histType *histData = (histType*)userPointer;
    double *colptr[MAXDIMS] = {0};
    int status = 0;
    long irow;

    if (firstrow == 1) {
      histData->rowselector_cur = histData->rowselector;
    }
    rowselect = histData->rowselector_cur;

    for (ii=0; ii<=4; ii++) {
      int startCol = histData->startCols[ii];
      iteratorCol *outcol = 0;
      /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
      colptr[ii] = 0;

      /* Do not process unspecified axes (but do process weight column) */
      if ( (ii >= histData->haxis && ii != 4) || histData->startCols[ii] < 0) continue;

      /* We have a parser for this, evaluate it */
      if (histData->parsers[ii].nCols > 0) {
	struct ParseStatusVariables *pv = &(histData->infos[ii].parseVariables);
	iteratorCol *colData = &(histData->iterCols[startCol]);
	int nCols = histData->parsers[ii].nCols;

	status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
				    nCols, colData, (void *) &(histData->infos[ii]));
	if (status) return status;
	/* Output column is last iterator column, which better be a TemporaryCol */
	outcol = &(colData[nCols-1]);

      } else {
	outcol = &(histData->iterCols[startCol]);
      }

      if (outcol) {
	/* Note that the 0th array element returned by the iterator is
	   actually the null value!  This is actually rather a big
	   undocumented "feature" of the iterator. However, "ii" below
	   starts at a value of 1 which skips over the null value */
	colptr[ii] = ((double *) fits_iter_get_array(outcol));
      }
    }

    /*  Main loop over rows */
    /* irow = row counter (1 .. nrows) */
    /* elem = counter of element (1 .. histData->repeat) for each row */
    /* ii = counts up from 1 (see note below) used to index colptr[]'s */

    /* Note that ii starts at 1 because position [0] in the 
       column data arrays is for the "null" value! */
    for (ii = 1, irow = 1; irow <= nrows; irow++) 
    {
        long elem;
        if (rowselect) {    /* if a row selector array is supplied... */

	  if (*rowselect) {
               rowselect++;   /* this row is included in the histogram */

	  } else {
               rowselect++;   /* this row is excluded from the histogram */

	       ii += histData->repeat; /* skip this portion of data */
               continue;
           }
        }


	/* Loop over elements in each row, increment ii after each element */

        for (elem = 1; elem <= histData->repeat; elem++, ii++) {
	  if (colptr[0][ii] == DOUBLENULLVALUE)  /* test for null value */
            continue;
	  if (colptr[4] && colptr[4][ii] == DOUBLENULLVALUE) /* and null weight */
	    continue;
	  
	  pix = (colptr[0][ii] - histData->amin1) / histData->binsize1;
	  ipix = (long) (pix + 1.); /* add 1 because the 1st pixel is the null value */
	  
	  /* test if bin is within range */
	  if (ipix < 1 || ipix > histData->haxis1 || pix > histData->maxbin1)
            continue;
	  
	  if (histData->haxis > 1)
	    {
	      if (colptr[1][ii] == DOUBLENULLVALUE)
		continue;
	      
	      axisbin = (colptr[1][ii] - histData->amin2) / histData->binsize2;
	      iaxisbin = (long) axisbin;
	      
	      if (axisbin < 0. || iaxisbin >= histData->haxis2 || axisbin > histData->maxbin2)
		continue;
	      
	      ipix += (iaxisbin * histData->incr[1]);
	      
	      if (histData->haxis > 2)
		{
		  if (colptr[2][ii] == DOUBLENULLVALUE)
		    continue;
		  
		  axisbin = (colptr[2][ii] - histData->amin3) / histData->binsize3;
		  iaxisbin = (long) axisbin;
		  if (axisbin < 0. || iaxisbin >= histData->haxis3 || axisbin > histData->maxbin3)
		    continue;
		  
		  ipix += (iaxisbin * histData->incr[2]);
		  
		  if (histData->haxis > 3)
		    {
		      if (colptr[3][ii] == DOUBLENULLVALUE)
			continue;
		      
		      axisbin = (colptr[3][ii] - histData->amin4) / histData->binsize4;
		      iaxisbin = (long) axisbin;
		      if (axisbin < 0. || iaxisbin >= histData->haxis4 || axisbin > histData->maxbin4)
			continue;
		      
		      ipix += (iaxisbin * histData->incr[3]);
		      
		    }  /* end of haxis > 3 case */
		}    /* end of haxis > 2 case */
	    }      /* end of haxis > 1 case */

	  /* increment the histogram pixel */
	  if (histData->weight != DOUBLENULLVALUE) /* constant weight factor */
	    {   /* Note that if wtrecip == 1, the reciprocal was precomputed above */
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) histData->weight;
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) histData->weight;
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += histData->weight;
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += histData->weight;
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) histData->weight;
	    }
	  else if (histData->wtrecip) /* use reciprocal of the weight */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) (1./colptr[4][ii]);
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) (1./colptr[4][ii]);
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += (float) (1./colptr[4][ii]);
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += 1./colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) (1./colptr[4][ii]);
	    }
	  else   /* no weights */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) colptr[4][ii];
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) colptr[4][ii];
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) colptr[4][ii];
	    }

	} /* end of loop over elements per row */

    }  /* end of main loop over all rows */

    histData->rowselector_cur = rowselect; /* Save row pointer for next go-round */
    return(status);
}